

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.cc
# Opt level: O2

void prometheus::detail::MetricsHandler::CleanupStalePointers
               (vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
                *collectables)

{
  pointer pwVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long lVar4;
  long lVar5;
  const_iterator __first;
  const_iterator __last;
  __weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  
  pwVar1 = (collectables->
           super__Vector_base<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (collectables->
       super__Vector_base<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)__last._M_current - (long)pwVar1;
  p_Var3 = &pwVar1[2].super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>;
  for (lVar5 = lVar4 >> 6; 0 < lVar5; lVar5 = lVar5 + -1) {
    p_Var2 = p_Var3[-2]._M_refcount._M_pi;
    if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var2->_M_use_count == 0)) {
      __first._M_current = (weak_ptr<prometheus::Collectable> *)(p_Var3 + -2);
      goto LAB_0011fcb8;
    }
    p_Var2 = p_Var3[-1]._M_refcount._M_pi;
    if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var2->_M_use_count == 0)) {
      __first._M_current = (weak_ptr<prometheus::Collectable> *)(p_Var3 + -1);
      goto LAB_0011fcb8;
    }
    p_Var2 = (p_Var3->_M_refcount)._M_pi;
    __first._M_current = (weak_ptr<prometheus::Collectable> *)p_Var3;
    if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var2->_M_use_count == 0)) goto LAB_0011fcb8;
    p_Var2 = p_Var3[1]._M_refcount._M_pi;
    if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var2->_M_use_count == 0)) {
      __first._M_current = (weak_ptr<prometheus::Collectable> *)(p_Var3 + 1);
      goto LAB_0011fcb8;
    }
    p_Var3 = p_Var3 + 4;
    lVar4 = lVar4 + -0x40;
  }
  lVar4 = lVar4 >> 4;
  p_Var6 = p_Var3 + -2;
  if (lVar4 == 1) {
LAB_0011fd62:
    p_Var2 = (p_Var6->_M_refcount)._M_pi;
    __first._M_current = (weak_ptr<prometheus::Collectable> *)p_Var6;
    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (p_Var2->_M_use_count != 0)) {
      __first._M_current = __last._M_current;
    }
  }
  else if (lVar4 == 3) {
    p_Var2 = p_Var3[-2]._M_refcount._M_pi;
    __first._M_current = (weak_ptr<prometheus::Collectable> *)p_Var6;
    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (p_Var2->_M_use_count != 0)) {
      p_Var6 = p_Var3 + -1;
      goto LAB_0011fd46;
    }
  }
  else {
    __first._M_current = __last._M_current;
    if (lVar4 != 2) goto LAB_0011fcf3;
LAB_0011fd46:
    p_Var2 = (p_Var6->_M_refcount)._M_pi;
    __first._M_current = (weak_ptr<prometheus::Collectable> *)p_Var6;
    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (p_Var2->_M_use_count != 0)) {
      p_Var6 = p_Var6 + 1;
      goto LAB_0011fd62;
    }
  }
LAB_0011fcb8:
  p_Var3 = &(__first._M_current)->
            super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>;
  if (__first._M_current != __last._M_current) {
    while (p_Var6 = p_Var3 + 1,
          p_Var6 != &(__last._M_current)->
                     super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>) {
      p_Var2 = p_Var3[1]._M_refcount._M_pi;
      p_Var3 = p_Var6;
      if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (p_Var2->_M_use_count != 0)) {
        std::__weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(__first._M_current)->
                    super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>,p_Var6);
        __first._M_current =
             (weak_ptr<prometheus::Collectable> *)
             (&(__first._M_current)->
               super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> + 1);
      }
    }
    __last._M_current =
         (collectables->
         super__Vector_base<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
LAB_0011fcf3:
  std::
  vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
  ::erase(collectables,__first,__last);
  return;
}

Assistant:

void MetricsHandler::CleanupStalePointers(
    std::vector<std::weak_ptr<Collectable>>& collectables) {
  collectables.erase(
      std::remove_if(std::begin(collectables), std::end(collectables),
                     [](const std::weak_ptr<Collectable>& candidate) {
                       return candidate.expired();
                     }),
      std::end(collectables));
}